

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::BackgroundPageQueue::PushFreePageEntry(BackgroundPageQueue *this,FreePageEntry *entry)

{
  CCLock::Enter(&(this->backgroundPageQueueCriticalSection).super_CCLock);
  entry->Next = this->bgFreePageList;
  this->bgFreePageList = entry;
  CCLock::Leave(&(this->backgroundPageQueueCriticalSection).super_CCLock);
  return;
}

Assistant:

void PushFreePageEntry(FreePageEntry* entry)
        {
#if SUPPORT_WIN32_SLIST
            ::InterlockedPushEntrySList(&bgFreePageList, entry);
#else
            AutoCriticalSection autoCS(&backgroundPageQueueCriticalSection);
            entry->Next = bgFreePageList;
            bgFreePageList = entry;
#endif
        }